

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

bool gflags::ReadFlagsFromString(string *flagfilecontents,char *param_2,bool errors_are_fatal)

{
  Mutex *pMVar1;
  int iVar2;
  bool bVar3;
  undefined1 uVar4;
  FlagRegistry *pFVar5;
  FlagSaverImpl saved_states;
  CommandLineFlagParser parser;
  FlagSaverImpl local_c8;
  CommandLineFlagParser local_a8;
  string local_40;
  
  pFVar5 = anon_unknown_2::FlagRegistry::GlobalRegistry();
  local_c8.backup_registry_.
  super__Vector_base<gflags::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<gflags::(anonymous_namespace)::CommandLineFlag_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.backup_registry_.
  super__Vector_base<gflags::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<gflags::(anonymous_namespace)::CommandLineFlag_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.backup_registry_.
  super__Vector_base<gflags::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<gflags::(anonymous_namespace)::CommandLineFlag_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.main_registry_ = pFVar5;
  FlagSaverImpl::SaveFromRegistry(&local_c8);
  local_a8.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.error_flags_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar1 = &pFVar5->lock_;
  iVar2 = pMVar1->mutex_;
  pMVar1->mutex_ = pMVar1->mutex_ + -1;
  local_a8.registry_ = pFVar5;
  local_a8.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8.error_flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8.undefined_names_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (iVar2 != 0) {
    __assert_fail("--mutex_ == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/mutex.h"
                  ,0xde,"void gflags_mutex_namespace::Mutex::Lock()");
  }
  anon_unknown_2::CommandLineFlagParser::ProcessOptionsFromStringLocked
            (&local_40,&local_a8,flagfilecontents,SET_FLAGS_VALUE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pMVar1 = &pFVar5->lock_;
  pMVar1->mutex_ = pMVar1->mutex_ + 1;
  if (pMVar1->mutex_ == 0) {
    HandleCommandLineHelpFlags();
    bVar3 = anon_unknown_2::CommandLineFlagParser::ReportErrors(&local_a8);
    if (bVar3) {
      if (errors_are_fatal) {
        uVar4 = (*(code *)gflags_exitfunc)(1);
        return (bool)uVar4;
      }
      FlagSaverImpl::RestoreToRegistry(&local_c8);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_a8.undefined_names_._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_a8.error_flags_._M_t);
    FlagSaverImpl::~FlagSaverImpl(&local_c8);
    return !bVar3;
  }
  __assert_fail("mutex_++ == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/mutex.h"
                ,0xdf,"void gflags_mutex_namespace::Mutex::Unlock()");
}

Assistant:

bool ReadFlagsFromString(const string& flagfilecontents,
                         const char* /*prog_name*/,  // TODO(csilvers): nix this
                         bool errors_are_fatal) {
  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  FlagSaverImpl saved_states(registry);
  saved_states.SaveFromRegistry();

  CommandLineFlagParser parser(registry);
  registry->Lock();
  parser.ProcessOptionsFromStringLocked(flagfilecontents, SET_FLAGS_VALUE);
  registry->Unlock();
  // Should we handle --help and such when reading flags from a string?  Sure.
  HandleCommandLineHelpFlags();
  if (parser.ReportErrors()) {
    // Error.  Restore all global flags to their previous values.
    if (errors_are_fatal)
      gflags_exitfunc(1);
    saved_states.RestoreToRegistry();
    return false;
  }
  return true;
}